

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datapiece.cc
# Opt level: O2

StatusOr<long> * __thiscall
google::protobuf::util::converter::(anonymous_namespace)::ValidateNumberConversion<long,float>
          (StatusOr<long> *__return_storage_ptr__,_anonymous_namespace_ *this,long after,
          float before)

{
  uint uVar1;
  char *pcVar2;
  ulong in_RCX;
  float fVar3;
  StringPiece value_str;
  string local_70;
  undefined1 local_50 [40];
  _anonymous_namespace_ *local_28;
  long after_local;
  
  local_28 = this;
  if (((float)(long)this == before) && (!NAN((float)(long)this) && !NAN(before))) {
    fVar3 = before;
    if (before != 0.0) {
      fVar3 = *(float *)(&DAT_0036c590 + (ulong)(0.0 < before) * 4);
    }
    uVar1 = ((0 < (long)this) - 1) + (uint)(0 < (long)this);
    if (this == (_anonymous_namespace_ *)0x0) {
      uVar1 = 0;
    }
    in_RCX = (ulong)uVar1;
    if ((fVar3 == (float)(int)uVar1) && (!NAN(fVar3) && !NAN((float)(int)uVar1))) {
      StatusOr<long>::StatusOr(__return_storage_ptr__,(long *)&local_28);
      return __return_storage_ptr__;
    }
  }
  FloatAsString_abi_cxx11_(&local_70,(converter *)this,before);
  pcVar2 = (char *)StringPiece::CheckedSsizeTFromSizeT(local_70._M_string_length);
  value_str.length_ = in_RCX;
  value_str.ptr_ = pcVar2;
  anon_unknown_1::InvalidArgument
            ((Status *)local_50,(anon_unknown_1 *)local_70._M_dataplus._M_p,value_str);
  StatusOr<long>::StatusOr(__return_storage_ptr__,(Status *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 8));
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

StatusOr<To> ValidateNumberConversion(To after, From before) {
  if (after == before &&
      MathUtil::Sign<From>(before) == MathUtil::Sign<To>(after)) {
    return after;
  } else {
    return InvalidArgument(std::is_integral<From>::value
                               ? ValueAsString(before)
                               : std::is_same<From, double>::value
                                     ? DoubleAsString(before)
                                     : FloatAsString(before));
  }
}